

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alsa.cpp
# Opt level: O1

ALCuint __thiscall anon_unknown.dwarf_259da0::AlsaCapture::availableSamples(AlsaCapture *this)

{
  RingBuffer *pRVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  undefined8 uVar6;
  ulong cnt;
  ulong uVar7;
  long lVar8;
  size_t sVar9;
  ll_ringbuffer_data_pair vec;
  ll_ringbuffer_data_pair local_50;
  
  if ((((((this->super_BackendBase).mDevice)->Connected)._M_base._M_i & 1U) == 0) ||
     (this->mDoCapture != true)) {
    uVar5 = 0;
  }
  else {
    uVar5 = (*(anonymous_namespace)::psnd_pcm_avail_update)(this->mPcmHandle);
  }
  if ((long)uVar5 < 0) {
    if (0 < (int)gLogLevel) {
      _GLOBAL__N_1::AlsaCapture::availableSamples();
    }
    iVar3 = (*(anonymous_namespace)::psnd_pcm_recover)(this->mPcmHandle,uVar5 & 0xffffffff,1);
    uVar5 = (ulong)iVar3;
    if (-1 < iVar3) {
      if (this->mDoCapture == true) {
        iVar3 = (*(anonymous_namespace)::psnd_pcm_start)(this->mPcmHandle);
        uVar5 = (ulong)iVar3;
      }
      if (-1 < (long)uVar5) {
        uVar5 = (*(anonymous_namespace)::psnd_pcm_avail_update)(this->mPcmHandle);
      }
    }
    if ((long)uVar5 < 0) {
      uVar6 = (*(anonymous_namespace)::psnd_strerror)(uVar5 & 0xffffffff);
      if (0 < (int)gLogLevel) {
        fprintf((FILE *)gLogFile,"[ALSOFT] (EE) restore error: %s\n",uVar6);
      }
      ALCdevice::handleDisconnect
                ((this->super_BackendBase).mDevice,"Capture recovery failure: %s",uVar6);
    }
  }
  if ((this->mRing)._M_t.super___uniq_ptr_impl<RingBuffer,_std::default_delete<RingBuffer>_>._M_t.
      super__Tuple_impl<0UL,_RingBuffer_*,_std::default_delete<RingBuffer>_>.
      super__Head_base<0UL,_RingBuffer_*,_false>._M_head_impl == (RingBuffer *)0x0) {
    uVar7 = 0;
    if (0 < (long)uVar5) {
      uVar7 = uVar5;
    }
    lVar8 = (*(anonymous_namespace)::psnd_pcm_bytes_to_frames)
                      (this->mPcmHandle,
                       (long)(this->mBuffer).
                             super__Vector_base<al::byte,_al::allocator<al::byte,_1UL>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)(this->mBuffer).
                             super__Vector_base<al::byte,_al::allocator<al::byte,_1UL>_>._M_impl.
                             super__Vector_impl_data._M_start);
    if (this->mLastAvail < (long)(lVar8 + uVar7)) {
      this->mLastAvail = lVar8 + uVar7;
    }
    uVar4 = (uint)this->mLastAvail;
  }
  else {
    if (0 < (long)uVar5) {
      do {
        RingBuffer::getWriteVector
                  (&local_50,
                   (this->mRing)._M_t.
                   super___uniq_ptr_impl<RingBuffer,_std::default_delete<RingBuffer>_>._M_t.
                   super__Tuple_impl<0UL,_RingBuffer_*,_std::default_delete<RingBuffer>_>.
                   super__Head_base<0UL,_RingBuffer_*,_false>._M_head_impl);
        uVar7 = uVar5;
        if (local_50.first.len == 0) {
          bVar2 = false;
        }
        else {
          sVar9 = local_50.first.len;
          if ((long)uVar5 < (long)local_50.first.len) {
            sVar9 = uVar5;
          }
          cnt = (*(anonymous_namespace)::psnd_pcm_readi)(this->mPcmHandle,local_50.first.buf,sVar9);
          if ((long)cnt < 0) {
            if (0 < (int)gLogLevel) {
              _GLOBAL__N_1::AlsaCapture::availableSamples();
            }
            bVar2 = true;
            if (cnt != 0xfffffffffffffff5) {
              iVar3 = (*(anonymous_namespace)::psnd_pcm_recover)
                                (this->mPcmHandle,cnt & 0xffffffff,1);
              uVar7 = (ulong)iVar3;
              if (-1 < iVar3) {
                if (this->mDoCapture == true) {
                  iVar3 = (*(anonymous_namespace)::psnd_pcm_start)(this->mPcmHandle);
                  uVar7 = (ulong)iVar3;
                }
                if (-1 < (long)uVar7) {
                  uVar7 = (*(anonymous_namespace)::psnd_pcm_avail_update)(this->mPcmHandle);
                }
              }
              if ((long)uVar7 < 0) {
                uVar6 = (*(anonymous_namespace)::psnd_strerror)(uVar7 & 0xffffffff);
                if (0 < (int)gLogLevel) {
                  fprintf((FILE *)gLogFile,"[ALSOFT] (EE) restore error: %s\n",uVar6);
                }
                bVar2 = false;
                ALCdevice::handleDisconnect
                          ((this->super_BackendBase).mDevice,"Capture recovery failure: %s",uVar6);
                uVar7 = uVar5;
              }
            }
          }
          else {
            RingBuffer::writeAdvance
                      ((this->mRing)._M_t.
                       super___uniq_ptr_impl<RingBuffer,_std::default_delete<RingBuffer>_>._M_t.
                       super__Tuple_impl<0UL,_RingBuffer_*,_std::default_delete<RingBuffer>_>.
                       super__Head_base<0UL,_RingBuffer_*,_false>._M_head_impl,cnt);
            bVar2 = true;
            uVar7 = uVar5 - cnt;
          }
        }
      } while ((bVar2) && (uVar5 = uVar7, 0 < (long)uVar7));
    }
    pRVar1 = (this->mRing)._M_t.super___uniq_ptr_impl<RingBuffer,_std::default_delete<RingBuffer>_>.
             _M_t.super__Tuple_impl<0UL,_RingBuffer_*,_std::default_delete<RingBuffer>_>.
             super__Head_base<0UL,_RingBuffer_*,_false>._M_head_impl;
    uVar4 = (int)(__int_type_conflict2)(pRVar1->mWritePtr).super___atomic_base<unsigned_long> -
            (int)(pRVar1->mReadPtr).super___atomic_base<unsigned_long>._M_i &
            (uint)pRVar1->mSizeMask;
  }
  return uVar4;
}

Assistant:

ALCuint AlsaCapture::availableSamples()
{
    snd_pcm_sframes_t avail{0};
    if(mDevice->Connected.load(std::memory_order_acquire) && mDoCapture)
        avail = snd_pcm_avail_update(mPcmHandle);
    if(avail < 0)
    {
        ERR("avail update failed: %s\n", snd_strerror(static_cast<int>(avail)));

        if((avail=snd_pcm_recover(mPcmHandle, static_cast<int>(avail), 1)) >= 0)
        {
            if(mDoCapture)
                avail = snd_pcm_start(mPcmHandle);
            if(avail >= 0)
                avail = snd_pcm_avail_update(mPcmHandle);
        }
        if(avail < 0)
        {
            const char *err{snd_strerror(static_cast<int>(avail))};
            ERR("restore error: %s\n", err);
            mDevice->handleDisconnect("Capture recovery failure: %s", err);
        }
    }

    if(!mRing)
    {
        if(avail < 0) avail = 0;
        avail += snd_pcm_bytes_to_frames(mPcmHandle, static_cast<ssize_t>(mBuffer.size()));
        if(avail > mLastAvail) mLastAvail = avail;
        return static_cast<ALCuint>(mLastAvail);
    }

    while(avail > 0)
    {
        auto vec = mRing->getWriteVector();
        if(vec.first.len == 0) break;

        snd_pcm_sframes_t amt{std::min(static_cast<snd_pcm_sframes_t>(vec.first.len), avail)};
        amt = snd_pcm_readi(mPcmHandle, vec.first.buf, static_cast<snd_pcm_uframes_t>(amt));
        if(amt < 0)
        {
            ERR("read error: %s\n", snd_strerror(static_cast<int>(amt)));

            if(amt == -EAGAIN)
                continue;
            if((amt=snd_pcm_recover(mPcmHandle, static_cast<int>(amt), 1)) >= 0)
            {
                if(mDoCapture)
                    amt = snd_pcm_start(mPcmHandle);
                if(amt >= 0)
                    amt = snd_pcm_avail_update(mPcmHandle);
            }
            if(amt < 0)
            {
                const char *err{snd_strerror(static_cast<int>(amt))};
                ERR("restore error: %s\n", err);
                mDevice->handleDisconnect("Capture recovery failure: %s", err);
                break;
            }
            avail = amt;
            continue;
        }

        mRing->writeAdvance(static_cast<snd_pcm_uframes_t>(amt));
        avail -= amt;
    }

    return static_cast<ALCuint>(mRing->readSpace());
}